

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t extraout_RDX;
  StringRef name;
  StringRef name_00;
  StringRef productName;
  bool local_351;
  bool local_319;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  allocator local_2c9;
  string local_2c8;
  undefined4 local_2a8;
  allocator local_2a1;
  value_type local_2a0;
  int local_27c;
  undefined1 local_278 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_258 [8];
  string command;
  string local_228;
  allocator local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  StringRef local_1b8;
  StringRef local_1a8;
  allocator local_191;
  value_type local_190;
  int local_170;
  allocator local_169;
  int i;
  undefined1 local_148 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  char *local_120 [2];
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  char **local_e0;
  char **argv_local;
  int argc_local;
  StringRef *local_c8;
  char *local_c0;
  StringRef *local_b8;
  char *local_b0;
  char **local_a8;
  char *local_a0;
  pointer *local_98;
  char *local_90;
  StringRef *local_88;
  char *local_80;
  undefined1 *local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  argv_local._4_4_ = 0;
  _argc_local = *argv;
  local_c8 = &local_f0;
  local_f0.Data = _argc_local;
  local_e0 = argv;
  argv_local._0_4_ = argc;
  if (_argc_local != (char *)0x0) {
    strlen(_argc_local);
  }
  llvm::sys::PrintStackTraceOnErrorSignal(local_f0,false);
  local_c0 = *local_e0;
  local_b8 = &local_110;
  local_110.Data = local_c0;
  if (local_c0 != (char *)0x0) {
    strlen(local_c0);
  }
  local_100 = llvm::sys::path::filename(local_110,native);
  local_a8 = local_120;
  local_b0 = "ninja";
  local_120[0] = "ninja";
  local_68 = strlen("ninja");
  local_50 = local_100.Data;
  local_48 = local_100.Length;
  local_60 = local_120[0];
  local_70 = local_120[0];
  local_38 = local_120[0];
  local_40 = &local_50;
  local_319 = false;
  local_58 = local_68;
  local_30 = local_68;
  if (local_100.Length == local_68) {
    local_18 = local_100.Data;
    local_20 = local_120[0];
    local_28 = local_68;
    if (local_68 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_100.Data,local_120[0],local_68);
    }
    local_319 = local_c == 0;
  }
  if (local_319) {
    local_98 = &args_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a0 = "llbuild";
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x322099;
    pcVar2 = (char *)strlen("llbuild");
    name.Length = extraout_RDX;
    name.Data = pcVar2;
    llbuild::commands::setProgramName
              ((commands *)
               args_1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"build",&local_169);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148,(value_type *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    for (local_170 = 1; local_170 != (int)argv_local; local_170 = local_170 + 1) {
      pcVar2 = local_e0[local_170];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,pcVar2,&local_191);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_148,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    argv_local._4_4_ =
         llbuild::commands::executeNinjaCommand
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  }
  else {
    local_90 = *local_e0;
    local_88 = &local_1b8;
    local_1b8.Data = local_90;
    if (local_90 != (char *)0x0) {
      strlen(local_90);
    }
    local_1a8 = llvm::sys::path::filename(local_1b8,native);
    name_00.Length = (char *)local_1a8.Length;
    name_00.Data = name_00.Length;
    llbuild::commands::setProgramName((commands *)local_1a8.Data,name_00);
    local_1da = 0;
    local_1db = 0;
    local_351 = true;
    if ((int)argv_local != 1) {
      pcVar2 = local_e0[1];
      std::allocator<char>::allocator();
      local_1da = 1;
      std::__cxx11::string::string((string *)&local_1d8,pcVar2,&local_1d9);
      local_1db = 1;
      local_351 = std::operator==(&local_1d8,"--help");
    }
    if ((local_1db & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    if ((local_1da & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
    if (local_351 != false) {
      usage();
    }
    pcVar2 = local_e0[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,pcVar2,&local_201);
    bVar1 = std::operator==(&local_200,"--version");
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    if (bVar1) {
      local_78 = (undefined1 *)((long)&command.field_2 + 8);
      local_80 = "llbuild";
      command.field_2._8_8_ = (long)"-for-llbuild" + 5;
      pcVar2 = (char *)strlen("llbuild");
      productName.Length = (size_t)pcVar2;
      productName.Data = pcVar2;
      llbuild::getLLBuildFullVersion_abi_cxx11_
                (&local_228,(llbuild *)command.field_2._8_8_,productName);
      uVar3 = std::__cxx11::string::c_str();
      printf("%s\n",uVar3);
      std::__cxx11::string::~string((string *)&local_228);
      argv_local._4_4_ = 0;
    }
    else {
      pcVar2 = local_e0[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_258,pcVar2,
                 (allocator *)
                 ((long)&args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_278);
      for (local_27c = 2; local_27c != (int)argv_local; local_27c = local_27c + 1) {
        pcVar2 = local_e0[local_27c];
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2a0,pcVar2,&local_2a1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_278,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_258,"ninja");
      if (bVar1) {
        argv_local._4_4_ =
             llbuild::commands::executeNinjaCommand
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_278);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_258,"buildengine");
        if (bVar1) {
          argv_local._4_4_ =
               llbuild::commands::executeBuildEngineCommand
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_278);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_258,"buildsystem");
          if (bVar1) {
            argv_local._4_4_ =
                 llbuild::commands::executeBuildSystemCommand
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_278);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_258,"analyze");
            __stream = _stderr;
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2c8,"llbuild-analyze",&local_2c9);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_2e8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_278);
              argv_local._4_4_ = executeExternalCommand(&local_2c8,&local_2e8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_2e8);
              std::__cxx11::string::~string((string *)&local_2c8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
            }
            else {
              pcVar2 = llbuild::commands::getProgramName();
              uVar3 = std::__cxx11::string::c_str();
              fprintf(__stream,"error: %s: unknown command \'%s\'\n",pcVar2,uVar3);
              argv_local._4_4_ = 1;
            }
          }
        }
      }
      local_2a8 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_278);
      std::__cxx11::string::~string((string *)local_258);
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char **argv) {
  // Print stacks on error.
  llvm::sys::PrintStackTraceOnErrorSignal(argv[0]);
  
  // Support use of llbuild as a replacement for ninja by indirecting to the
  // `ninja build` subtool when invoked under the name `ninja.
  if (llvm::sys::path::filename(argv[0]) == "ninja") {
    // We still want to represent ourselves as llbuild in output messages.
    setProgramName("llbuild");

    std::vector<std::string> args;
    args.push_back("build");
    for (int i = 1; i != argc; ++i) {
      args.push_back(argv[i]);
    }
    return executeNinjaCommand(args);
  } else {
    setProgramName(llvm::sys::path::filename(argv[0]));
  }

  // Expect the first argument to be the name of a subtool to delegate to.
  if (argc == 1 || std::string(argv[1]) == "--help")
    usage();

  if (std::string(argv[1]) == "--version") {
    // Print the version and exit.
    printf("%s\n", getLLBuildFullVersion().c_str());
    return 0;
  }

  // Otherwise, expect a command name.
  std::string command(argv[1]);
  std::vector<std::string> args;
  for (int i = 2; i != argc; ++i) {
    args.push_back(argv[i]);
  }

  if (command == "ninja") {
    return executeNinjaCommand(args);
  } else if (command == "buildengine") {
    return executeBuildEngineCommand(args);
  } else if (command == "buildsystem") {
    return executeBuildSystemCommand(args);
  } else if (command == "analyze") {
    // Next to the llbuild binary we build a llbuild-analyze binary with SwiftPM
    // which we treat as a subtool to llbuild. If that doesn't exist, the exec
    // will fail.
    return executeExternalCommand("llbuild-analyze", args);
  } else {
    fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
            command.c_str());
    return 1;
  }
}